

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O1

void threads_end(lzma_stream_coder_conflict1 *coder,lzma_allocator *allocator)

{
  worker_thread *pwVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if (coder->threads_initialized != 0) {
    uVar4 = 0;
    do {
      bVar2 = true;
      while( true ) {
        if (bVar2) {
          iVar3 = pthread_mutex_lock((pthread_mutex_t *)&coder->threads[uVar4].mutex);
          if (iVar3 != 0) {
            __assert_fail("ret == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                          ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
          }
        }
        else {
          iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&coder->threads[uVar4].mutex);
          if (iVar3 != 0) {
            __assert_fail("ret == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                          ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
          }
        }
        if (!bVar2) break;
        pwVar1 = coder->threads;
        pwVar1[uVar4].state = THR_EXIT;
        iVar3 = pthread_cond_signal((pthread_cond_t *)&pwVar1[uVar4].cond);
        bVar2 = false;
        if (iVar3 != 0) {
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0x10c,"void mythread_cond_signal(mythread_cond *)");
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < coder->threads_initialized);
  }
  if (coder->threads_initialized != 0) {
    lVar5 = 0x1b8;
    uVar4 = 0;
    do {
      iVar3 = pthread_join(*(pthread_t *)((long)&coder->threads->state + lVar5),(void **)0x0);
      if (iVar3 != 0) {
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                      ,0x1cd,"void threads_end(lzma_stream_coder *, const lzma_allocator *)");
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x1c0;
    } while (uVar4 < coder->threads_initialized);
  }
  lzma_free(coder->threads,allocator);
  return;
}

Assistant:

static void
threads_end(lzma_stream_coder *coder, const lzma_allocator *allocator)
{
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			coder->threads[i].state = THR_EXIT;
			mythread_cond_signal(&coder->threads[i].cond);
		}
	}

	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		int ret = mythread_join(coder->threads[i].thread_id);
		assert(ret == 0);
		(void)ret;
	}

	lzma_free(coder->threads, allocator);
	return;
}